

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O0

void __thiscall
duckdb::AlpRDCompressionState<float>::FlushVector(AlpRDCompressionState<float> *this)

{
  uint uVar1;
  AlpRDCompressionState<float> *in_RDI;
  
  Store<unsigned_short>(&(in_RDI->state).exceptions_count,in_RDI->data_ptr);
  in_RDI->data_ptr = in_RDI->data_ptr + 2;
  memcpy(in_RDI->data_ptr,(in_RDI->state).left_parts_encoded,(in_RDI->state).left_bit_packed_size);
  in_RDI->data_ptr = in_RDI->data_ptr + (in_RDI->state).left_bit_packed_size;
  memcpy(in_RDI->data_ptr,(in_RDI->state).right_parts_encoded,(in_RDI->state).right_bit_packed_size)
  ;
  in_RDI->data_ptr = in_RDI->data_ptr + (in_RDI->state).right_bit_packed_size;
  if ((in_RDI->state).exceptions_count != 0) {
    memcpy(in_RDI->data_ptr,(in_RDI->state).exceptions,
           (long)(int)((uint)(in_RDI->state).exceptions_count << 1));
    in_RDI->data_ptr = in_RDI->data_ptr + (int)((uint)(in_RDI->state).exceptions_count << 1);
    memcpy(in_RDI->data_ptr,(in_RDI->state).exceptions_positions,
           (long)(int)((uint)(in_RDI->state).exceptions_count << 1));
    in_RDI->data_ptr = in_RDI->data_ptr + (int)((uint)(in_RDI->state).exceptions_count << 1);
  }
  in_RDI->data_bytes_used =
       (in_RDI->state).left_bit_packed_size + (in_RDI->state).right_bit_packed_size +
       (long)(int)((uint)(in_RDI->state).exceptions_count << 2) + 2 + in_RDI->data_bytes_used;
  in_RDI->metadata_ptr = in_RDI->metadata_ptr + -4;
  Store<unsigned_int>(&in_RDI->next_vector_byte_index_start,in_RDI->metadata_ptr);
  UsedSpace(in_RDI);
  uVar1 = NumericCast<unsigned_int,unsigned_long,void>(0xab4028);
  in_RDI->next_vector_byte_index_start = uVar1;
  in_RDI->vectors_flushed = in_RDI->vectors_flushed + 1;
  in_RDI->vector_idx = 0;
  in_RDI->nulls_idx = 0;
  ResetVector((AlpRDCompressionState<float> *)0xab4051);
  return;
}

Assistant:

void FlushVector() {
		Store<uint16_t>(state.exceptions_count, data_ptr);
		data_ptr += AlpRDConstants::EXCEPTIONS_COUNT_SIZE;

		memcpy((void *)data_ptr, (void *)state.left_parts_encoded, state.left_bit_packed_size);
		data_ptr += state.left_bit_packed_size;

		memcpy((void *)data_ptr, (void *)state.right_parts_encoded, state.right_bit_packed_size);
		data_ptr += state.right_bit_packed_size;

		if (state.exceptions_count > 0) {
			memcpy((void *)data_ptr, (void *)state.exceptions, AlpRDConstants::EXCEPTION_SIZE * state.exceptions_count);
			data_ptr += AlpRDConstants::EXCEPTION_SIZE * state.exceptions_count;
			memcpy((void *)data_ptr, (void *)state.exceptions_positions,
			       AlpRDConstants::EXCEPTION_POSITION_SIZE * state.exceptions_count);
			data_ptr += AlpRDConstants::EXCEPTION_POSITION_SIZE * state.exceptions_count;
		}

		data_bytes_used +=
		    state.left_bit_packed_size + state.right_bit_packed_size +
		    (state.exceptions_count * (AlpRDConstants::EXCEPTION_SIZE + AlpRDConstants::EXCEPTION_POSITION_SIZE)) +
		    AlpRDConstants::EXCEPTIONS_COUNT_SIZE;

		// Write pointer to the vector data (metadata)
		metadata_ptr -= AlpRDConstants::METADATA_POINTER_SIZE;
		Store<uint32_t>(next_vector_byte_index_start, metadata_ptr);
		next_vector_byte_index_start = NumericCast<uint32_t>(UsedSpace());

		vectors_flushed++;
		vector_idx = 0;
		nulls_idx = 0;
		ResetVector();
	}